

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

ssize_t __thiscall Arcflow::write(Arcflow *this,int __fd,void *__buf,size_t __n)

{
  undefined8 __stream;
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  iterator iVar3;
  iterator iVar4;
  size_type sVar5;
  uint *puVar6;
  reference pAVar7;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  Arc *a;
  iterator __end2;
  iterator __begin2;
  vector<Arc,_std::allocator<Arc>_> *__range2;
  int i;
  int local_140;
  int lastv;
  int t;
  int iS;
  char local_118 [8];
  char _error_msg_ [256];
  FILE *fout_local;
  Arcflow *this_local;
  
  _error_msg_._252_4_ = in_register_00000034;
  _error_msg_._248_4_ = __fd;
  if ((this->ready & 1U) == 1) {
    iVar3 = std::vector<Arc,_std::allocator<Arc>_>::begin(&this->A);
    iVar4 = std::vector<Arc,_std::allocator<Arc>_>::end(&this->A);
    std::sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>>
              ((__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>)iVar3._M_current,
               (__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>)iVar4._M_current);
    fprintf((FILE *)_error_msg_._248_8_,"#GRAPH_BEGIN#\n");
    fprintf((FILE *)_error_msg_._248_8_,"$NBTYPES{%d};\n",(ulong)(uint)(this->inst).nbtypes);
    fprintf((FILE *)_error_msg_._248_8_,"$S{%d};\n",0);
    fprintf((FILE *)_error_msg_._248_8_,"$Ts{");
    for (local_140 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->Ts),
        local_140 < (int)sVar5; local_140 = local_140 + 1) {
      if (local_140 != 0) {
        fprintf((FILE *)_error_msg_._248_8_,",");
      }
      __stream = _error_msg_._248_8_;
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)local_140)
      ;
      fprintf((FILE *)__stream,"%d",(ulong)*puVar6);
    }
    fprintf((FILE *)_error_msg_._248_8_,"};\n");
    fprintf((FILE *)_error_msg_._248_8_,"$LOSS{%d};\n",(ulong)(uint)this->LOSS);
    iVar2 = NodeSet::size(&this->NS);
    fprintf((FILE *)_error_msg_._248_8_,"$NV{%d};\n",(ulong)(uint)this->NV);
    fprintf((FILE *)_error_msg_._248_8_,"$NA{%d};\n",(ulong)(uint)this->NA);
    iVar3 = std::vector<Arc,_std::allocator<Arc>_>::begin(&this->A);
    iVar4 = std::vector<Arc,_std::allocator<Arc>_>::end(&this->A);
    std::sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>>
              ((__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>)iVar3._M_current,
               (__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>)iVar4._M_current);
    fprintf((FILE *)_error_msg_._248_8_,"$ARCS{\n");
    for (__range2._4_4_ = 0; __range2._4_4_ < 3; __range2._4_4_ = __range2._4_4_ + 1) {
      __end2 = std::vector<Arc,_std::allocator<Arc>_>::begin(&this->A);
      a = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(&this->A);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>
                                         *)&a), bVar1) {
        pAVar7 = __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::
                 operator*(&__end2);
        if ((((__range2._4_4_ != 1) || (pAVar7->u == 0)) &&
            ((__range2._4_4_ != 2 || (iVar2 + -1 < pAVar7->v)))) &&
           ((__range2._4_4_ != 0 || ((pAVar7->u != 0 && (pAVar7->v <= iVar2 + -1)))))) {
          if (pAVar7->label == this->LOSS) {
            fprintf((FILE *)_error_msg_._248_8_,"%d %d %d\n",(ulong)(uint)pAVar7->u,
                    (ulong)(uint)pAVar7->v,(ulong)(uint)this->LOSS);
          }
          else {
            fprintf((FILE *)_error_msg_._248_8_,"%d %d %d\n",(ulong)(uint)pAVar7->u,
                    (ulong)(uint)pAVar7->v,(ulong)(uint)pAVar7->label);
          }
        }
        __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator++
                  (&__end2);
      }
    }
    fprintf((FILE *)_error_msg_._248_8_,"};\n");
    iVar2 = fprintf((FILE *)_error_msg_._248_8_,"#GRAPH_END#\n");
    return CONCAT44(extraout_var,iVar2);
  }
  snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","ready == true"
           ,
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x211);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_118);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::write(FILE *fout) {
	throw_assert(ready == true);
	sort(all(A));

	int iS = 0;
	fprintf(fout, "#GRAPH_BEGIN#\n");
	fprintf(fout, "$NBTYPES{%d};\n", inst.nbtypes);
	fprintf(fout, "$S{%d};\n", iS);
	fprintf(fout, "$Ts{");
	for (int t = 0; t < static_cast<int>(Ts.size()); t++) {
		if (t) fprintf(fout, ",");
		fprintf(fout, "%d", Ts[t]);
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$LOSS{%d};\n", LOSS);

	int lastv = NS.size() - 1;
	fprintf(fout, "$NV{%d};\n", NV);
	fprintf(fout, "$NA{%d};\n", NA);

	sort(all(A));
	fprintf(fout, "$ARCS{\n");
	for (int i = 0; i < 3; i++) {
		for (const Arc &a : A) {
			if (i == 1 && a.u != iS) {
				continue;
			} else if (i == 2 && a.v <= lastv) {
				continue;
			} else if (i == 0 && (a.u == iS || a.v > lastv)) {
				continue;
			}
			if (a.label == LOSS) {
				fprintf(fout, "%d %d %d\n", a.u, a.v, LOSS);
			} else {
				fprintf(fout, "%d %d %d\n", a.u, a.v, a.label);
			}
		}
	}
	fprintf(fout, "};\n");
	fprintf(fout, "#GRAPH_END#\n");
}